

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

void __thiscall
FIX::SocketMonitor::processRead(SocketMonitor *this,Strategy *strategy,socket_handle socket_fd)

{
  uint in_EAX;
  ulong uStack_18;
  socket_handle socket;
  
  if (this->m_interrupt == socket_fd) {
    uStack_18 = (ulong)in_EAX;
    recv(socket_fd,&socket,4,0);
    addWrite(this,socket);
    return;
  }
  (*strategy->_vptr_Strategy[3])(strategy,this);
  return;
}

Assistant:

void SocketMonitor::processRead(Strategy &strategy, socket_handle socket_fd) {
  int s = socket_fd;
  if (s == m_interrupt) {
    socket_handle socket = 0;
    recv(s, (char *)&socket, sizeof(socket), 0);
    addWrite(socket);
  } else {
    strategy.onEvent(*this, s);
  }
}